

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::
~GeometryShaderMaxOutputComponentsSinglePointTest
          (GeometryShaderMaxOutputComponentsSinglePointTest *this)

{
  GeometryShaderMaxOutputComponentsSinglePointTest *this_local;
  
  ~GeometryShaderMaxOutputComponentsSinglePointTest(this);
  operator_delete(this,0x370);
  return;
}

Assistant:

virtual ~GeometryShaderMaxOutputComponentsSinglePointTest()
	{
	}